

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

bool __thiscall OrPattern::alwaysFalse(OrPattern *this)

{
  bool bVar1;
  uint uVar2;
  reference ppDVar3;
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  local_30;
  DisjointPattern **local_28;
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  local_20;
  const_iterator iter;
  OrPattern *this_local;
  
  iter._M_current = (DisjointPattern **)this;
  __gnu_cxx::
  __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
  ::__normal_iterator(&local_20);
  local_28 = (DisjointPattern **)
             std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::begin
                       (&this->orlist);
  local_20._M_current = local_28;
  while( true ) {
    local_30._M_current =
         (DisjointPattern **)
         std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>::end(&this->orlist);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) {
      return true;
    }
    ppDVar3 = __gnu_cxx::
              __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
              ::operator*(&local_20);
    uVar2 = (*((*ppDVar3)->super_Pattern)._vptr_Pattern[0xb])();
    if ((uVar2 & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<DisjointPattern_*const_*,_std::vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>_>
    ::operator++(&local_20);
  }
  return false;
}

Assistant:

bool OrPattern::alwaysFalse(void) const

{
  vector<DisjointPattern *>::const_iterator iter;

  for(iter=orlist.begin();iter!=orlist.end();++iter)
    if (!(*iter)->alwaysFalse()) return false;
  return true;
}